

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::RenderRectFilledRangeH
               (ImDrawList *draw_list,ImRect *rect,ImU32 col,float x_start_norm,float x_end_norm,
               float rounding)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_8c;
  float local_88;
  float local_78;
  ImVec2 p1;
  ImVec2 p0;
  
  if ((x_end_norm == x_start_norm) && (!NAN(x_end_norm) && !NAN(x_start_norm))) {
    return;
  }
  fVar3 = x_start_norm;
  if (x_start_norm <= x_end_norm) {
    fVar3 = x_end_norm;
    x_end_norm = x_start_norm;
  }
  fVar6 = (rect->Min).x;
  fVar1 = (rect->Min).y;
  fVar8 = (rect->Max).x - fVar6;
  fVar7 = x_end_norm * fVar8 + fVar6;
  fVar4 = fVar3 * fVar8 + fVar6;
  fVar3 = (rect->Max).y;
  p1.x = fVar4;
  p1.y = fVar3;
  p0.x = fVar7;
  p0.y = fVar1;
  if ((rounding != 0.0) || (NAN(rounding))) {
    fVar9 = (fVar3 - fVar1) * 0.5;
    fVar5 = fVar8 * 0.5;
    if (fVar9 <= fVar8 * 0.5) {
      fVar5 = fVar9;
    }
    fVar5 = fVar5 + -1.0;
    if (fVar5 <= rounding) {
      rounding = fVar5;
    }
    local_a8 = (float)(~-(uint)(fVar5 < 0.0) & (uint)rounding);
    uStack_a4 = in_XMM2_Db;
    uStack_a0 = in_XMM2_Dc;
    uStack_9c = in_XMM2_Dd;
    local_78 = 1.0 / local_a8;
    local_88 = ImAcos01(1.0 - (fVar7 - fVar6) * local_78);
    fVar8 = ImAcos01(1.0 - (fVar4 - (rect->Min).x) * local_78);
    fVar6 = (rect->Min).x + local_a8;
    uVar2 = -(uint)(fVar6 <= fVar7);
    fVar6 = (float)(uVar2 & (uint)fVar7 | ~uVar2 & (uint)fVar6);
    local_b0.x = fVar6;
    if ((local_88 != fVar8) || (NAN(local_88) || NAN(fVar8))) {
      local_b0.y = fVar3 - local_a8;
      if ((local_88 != 0.0) || (((NAN(local_88) || (fVar8 != 1.5707964)) || (NAN(fVar8))))) {
        local_8c = fVar8;
        ImDrawList::PathArcTo(draw_list,&local_b0,local_a8,3.1415927 - fVar8,3.1415927 - local_88,3)
        ;
        local_b0.y = local_a8 + fVar1;
        local_b0.x = fVar6;
        ImDrawList::PathArcTo
                  (draw_list,&local_b0,local_a8,local_88 + 3.1415927,local_8c + 3.1415927,3);
      }
      else {
        ImDrawList::PathArcToFast(draw_list,&local_b0,local_a8,3,6);
        local_b0.y = local_a8 + fVar1;
        local_b0.x = fVar6;
        ImDrawList::PathArcToFast(draw_list,&local_b0,local_a8,6,9);
      }
    }
    else {
      local_b0.y = fVar3;
      ImVector<ImVec2>::push_back(&draw_list->_Path,&local_b0);
      local_b0.x = fVar6;
      local_b0.y = fVar1;
      ImVector<ImVec2>::push_back(&draw_list->_Path,&local_b0);
    }
    if ((rect->Min).x + local_a8 < fVar4) {
      local_88 = ImAcos01(1.0 - ((rect->Max).x - fVar4) * local_78);
      fVar6 = ImAcos01(1.0 - ((rect->Max).x - fVar7) * local_78);
      fVar7 = (rect->Max).x - local_a8;
      if (fVar7 <= fVar4) {
        fVar4 = fVar7;
      }
      local_b0.x = fVar4;
      if ((local_88 != fVar6) || (NAN(local_88) || NAN(fVar6))) {
        local_b0.y = fVar1 + local_a8;
        if (((local_88 != 0.0) || ((NAN(local_88) || (fVar6 != 1.5707964)))) || (NAN(fVar6))) {
          local_78 = fVar6;
          ImDrawList::PathArcTo(draw_list,&local_b0,local_a8,-fVar6,-local_88,3);
          local_b0.y = fVar3 - local_a8;
          local_b0.x = fVar4;
          ImDrawList::PathArcTo(draw_list,&local_b0,local_a8,local_88,local_78,3);
        }
        else {
          ImDrawList::PathArcToFast(draw_list,&local_b0,local_a8,9,0xc);
          local_b0.y = fVar3 - local_a8;
          local_b0.x = fVar4;
          ImDrawList::PathArcToFast(draw_list,&local_b0,local_a8,0,3);
        }
      }
      else {
        local_b0.y = fVar1;
        ImVector<ImVec2>::push_back(&draw_list->_Path,&local_b0);
        local_b0.x = fVar4;
        local_b0.y = fVar3;
        ImVector<ImVec2>::push_back(&draw_list->_Path,&local_b0);
      }
    }
    ImDrawList::PathFillConvex(draw_list,col);
  }
  else {
    ImDrawList::AddRectFilled(draw_list,&p0,&p1,col,0.0,0);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledRangeH(ImDrawList* draw_list, const ImRect& rect, ImU32 col, float x_start_norm, float x_end_norm, float rounding)
{
    if (x_end_norm == x_start_norm)
        return;
    if (x_start_norm > x_end_norm)
        ImSwap(x_start_norm, x_end_norm);

    ImVec2 p0 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_start_norm), rect.Min.y);
    ImVec2 p1 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_end_norm), rect.Max.y);
    if (rounding == 0.0f)
    {
        draw_list->AddRectFilled(p0, p1, col, 0.0f);
        return;
    }

    rounding = ImClamp(ImMin((rect.Max.x - rect.Min.x) * 0.5f, (rect.Max.y - rect.Min.y) * 0.5f) - 1.0f, 0.0f, rounding);
    const float inv_rounding = 1.0f / rounding;
    const float arc0_b = ImAcos01(1.0f - (p0.x - rect.Min.x) * inv_rounding);
    const float arc0_e = ImAcos01(1.0f - (p1.x - rect.Min.x) * inv_rounding);
    const float half_pi = IM_PI * 0.5f; // We will == compare to this because we know this is the exact value ImAcos01 can return.
    const float x0 = ImMax(p0.x, rect.Min.x + rounding);
    if (arc0_b == arc0_e)
    {
        draw_list->PathLineTo(ImVec2(x0, p1.y));
        draw_list->PathLineTo(ImVec2(x0, p0.y));
    }
    else if (arc0_b == 0.0f && arc0_e == half_pi)
    {
        draw_list->PathArcToFast(ImVec2(x0, p1.y - rounding), rounding, 3, 6); // BL
        draw_list->PathArcToFast(ImVec2(x0, p0.y + rounding), rounding, 6, 9); // TR
    }
    else
    {
        draw_list->PathArcTo(ImVec2(x0, p1.y - rounding), rounding, IM_PI - arc0_e, IM_PI - arc0_b, 3); // BL
        draw_list->PathArcTo(ImVec2(x0, p0.y + rounding), rounding, IM_PI + arc0_b, IM_PI + arc0_e, 3); // TR
    }
    if (p1.x > rect.Min.x + rounding)
    {
        const float arc1_b = ImAcos01(1.0f - (rect.Max.x - p1.x) * inv_rounding);
        const float arc1_e = ImAcos01(1.0f - (rect.Max.x - p0.x) * inv_rounding);
        const float x1 = ImMin(p1.x, rect.Max.x - rounding);
        if (arc1_b == arc1_e)
        {
            draw_list->PathLineTo(ImVec2(x1, p0.y));
            draw_list->PathLineTo(ImVec2(x1, p1.y));
        }
        else if (arc1_b == 0.0f && arc1_e == half_pi)
        {
            draw_list->PathArcToFast(ImVec2(x1, p0.y + rounding), rounding, 9, 12); // TR
            draw_list->PathArcToFast(ImVec2(x1, p1.y - rounding), rounding, 0, 3);  // BR
        }
        else
        {
            draw_list->PathArcTo(ImVec2(x1, p0.y + rounding), rounding, -arc1_e, -arc1_b, 3); // TR
            draw_list->PathArcTo(ImVec2(x1, p1.y - rounding), rounding, +arc1_b, +arc1_e, 3); // BR
        }
    }
    draw_list->PathFillConvex(col);
}